

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O1

bool __thiscall BoolLinearLE<0>::propagate(BoolLinearLE<0> *this)

{
  Tint *pTVar1;
  int iVar2;
  uint uVar3;
  IntVar *pIVar4;
  BoolView *pBVar5;
  int iVar6;
  bool bVar7;
  ulong uVar8;
  int *pt;
  long lVar9;
  TrailElem local_38;
  
  iVar2 = (((this->y).var)->max).v;
  pTVar1 = &this->ones;
  iVar6 = (this->ones).v;
  if (iVar2 < iVar6) {
    local_38.sz = 4;
    local_38.pt = &pTVar1->v;
    local_38.x = iVar6;
    vec<TrailElem>::push(&engine.trail,&local_38);
    pTVar1->v = iVar2 + 1;
  }
  iVar6 = (this->ones).v;
  pIVar4 = (this->y).var;
  if ((pIVar4->min).v < iVar6) {
    iVar6 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar4,(long)iVar6,(ulong)(uint)(this->super_Propagator).prop_id << 0x20 | 5,
                       1);
    if ((char)iVar6 == '\0') {
      bVar7 = false;
      goto LAB_0014aa8b;
    }
  }
  bVar7 = true;
LAB_0014aa8b:
  if (((bVar7 != false) && (pTVar1->v == iVar2)) && ((this->x).sz != 0)) {
    lVar9 = 0xc;
    uVar8 = 0;
    do {
      pBVar5 = (this->x).data;
      uVar3 = *(uint *)((long)pBVar5 + lVar9 + -4);
      if (sat.assigns.data[uVar3] == '\0') {
        SAT::enqueue(&sat,(Lit)((*(byte *)((long)&(pBVar5->super_Var).super_Branching.
                                                  _vptr_Branching + lVar9) ^ 1) + uVar3 * 2),
                     (Reason)(((ulong)(uint)(this->super_Propagator).prop_id << 0x20) + 1));
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < (this->x).sz);
  }
  return bVar7;
}

Assistant:

bool propagate() override {
		const int y_max = static_cast<int>(y.getMax());

		if (ones > y_max) {
			ones = y_max + 1;
		}

		setDom2(y, setMin, ones, 1);

		if (ones == y_max) {
			for (unsigned int i = 0; i < x.size(); i++) {
				if (!x[i].isFixed()) {
					x[i].setVal2(false, Reason(prop_id, 0));
				}
			}
		}

		return true;
	}